

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3Fts5Strndup(int *pRc,char *pIn,int nIn)

{
  size_t sVar1;
  char *local_28;
  char *zRet;
  int nIn_local;
  char *pIn_local;
  int *pRc_local;
  
  local_28 = (char *)0x0;
  if (*pRc == 0) {
    zRet._4_4_ = nIn;
    if (nIn < 0) {
      sVar1 = strlen(pIn);
      zRet._4_4_ = (int)sVar1;
    }
    local_28 = (char *)sqlite3_malloc(zRet._4_4_ + 1);
    if (local_28 == (char *)0x0) {
      *pRc = 7;
    }
    else {
      memcpy(local_28,pIn,(long)zRet._4_4_);
      local_28[zRet._4_4_] = '\0';
    }
  }
  return local_28;
}

Assistant:

static char *sqlite3Fts5Strndup(int *pRc, const char *pIn, int nIn){
  char *zRet = 0;
  if( *pRc==SQLITE_OK ){
    if( nIn<0 ){
      nIn = (int)strlen(pIn);
    }
    zRet = (char*)sqlite3_malloc(nIn+1);
    if( zRet ){
      memcpy(zRet, pIn, nIn);
      zRet[nIn] = '\0';
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
  return zRet;
}